

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

void __thiscall wasm::DAEScanner::visitRefFunc(DAEScanner *this,RefFunc *curr)

{
  unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
  *this_00;
  mapped_type *local_50;
  Name local_30;
  mapped_type *local_20;
  DAEFunctionInfo *currInfo;
  RefFunc *curr_local;
  DAEScanner *this_local;
  
  currInfo = (DAEFunctionInfo *)curr;
  curr_local = (RefFunc *)this;
  if (this->info == (DAEFunctionInfo *)0x0) {
    this_00 = this->infoMap;
    wasm::Name::Name(&local_30);
    local_50 = std::
               unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
               ::operator[](this_00,&local_30);
  }
  else {
    local_50 = this->info;
  }
  local_20 = local_50;
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::insert(&local_50->hasUnseenCalls,
           (value_type *)
           &(currInfo->unusedParams).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void visitRefFunc(RefFunc* curr) {
    // RefFunc may be visited from either a function, in which case |info| was
    // set, or module-level code (in which case we use the null function name in
    // the infoMap).
    auto* currInfo = info ? info : &(*infoMap)[Name()];

    // Treat a ref.func as an unseen call, preventing us from changing the
    // function's type. If we did change it, it could be an observable
    // difference from the outside, if the reference escapes, for example.
    // TODO: look for actual escaping?
    // TODO: create a thunk for external uses that allow internal optimizations
    currInfo->hasUnseenCalls.insert(curr->func);
  }